

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMeshType.cpp
# Opt level: O2

ostream * operator<<(ostream *out,MMeshType meshType)

{
  string local_30;
  
  MMeshType_Name_abi_cxx11_(&local_30,meshType);
  std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const MMeshType meshType)
{
    out << MMeshType_Name(meshType);
    return out;
}